

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__skip(stbi__context *s,int n)

{
  int iVar1;
  int iVar2;
  
  if (n != 0) {
    if (n < 0) {
      s->img_buffer = s->img_buffer_end;
    }
    else {
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
        iVar1 = n - iVar2;
        if (iVar1 != 0 && iVar2 <= n) {
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,iVar1);
          return;
        }
      }
      s->img_buffer = s->img_buffer + (uint)n;
    }
  }
  return;
}

Assistant:

static void stbi__skip(stbi__context *s, int n)
{
   if (n == 0) return;  // already there!
   if (n < 0) {
      s->img_buffer = s->img_buffer_end;
      return;
   }
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         s->img_buffer = s->img_buffer_end;
         (s->io.skip)(s->io_user_data, n - blen);
         return;
      }
   }
   s->img_buffer += n;
}